

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O3

pool_ptr<soul::heart::Variable> __thiscall
soul::heart::Parser::findVariable(Parser *this,FunctionParseState *state,string *name)

{
  long *plVar1;
  pointer pcVar2;
  long lVar3;
  pointer pBVar4;
  char *pcVar5;
  char *pcVar6;
  size_t sVar7;
  Block *pBVar8;
  bool bVar9;
  long lVar10;
  _func_int **pp_Var11;
  undefined8 *in_RCX;
  long lVar12;
  pool_ref<soul::heart::Variable> *v;
  long *plVar13;
  string_view other;
  string_view other_00;
  string_view other_01;
  string_view other_02;
  string variableName;
  TokenisedPathString path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  undefined1 local_e8 [184];
  
  lVar10 = std::__cxx11::string::find((char)in_RCX,0x3a);
  if (lVar10 == -1) {
    plVar1 = (long *)name[1]._M_string_length;
    for (plVar13 = (long *)name[1]._M_dataplus._M_p; plVar13 != plVar1; plVar13 = plVar13 + 1) {
      other._M_str = (char *)*in_RCX;
      other._M_len = in_RCX[1];
      bVar9 = Identifier::operator==((Identifier *)(*plVar13 + 0x30),other);
      if (bVar9) goto LAB_0022de60;
    }
    pcVar2 = (name->_M_dataplus)._M_p;
    lVar10 = *(long *)(pcVar2 + 0x40);
    if (lVar10 != 0) {
      lVar3 = *(long *)(pcVar2 + 0x38);
      lVar12 = 0;
      do {
        other_00._M_str = (char *)*in_RCX;
        other_00._M_len = in_RCX[1];
        bVar9 = Identifier::operator==((Identifier *)(*(long *)(lVar3 + lVar12) + 0x30),other_00);
        if (bVar9) {
          pp_Var11 = *(_func_int ***)(lVar3 + lVar12);
          goto LAB_0022de7a;
        }
        lVar12 = lVar12 + 8;
      } while (lVar10 << 3 != lVar12);
    }
    pBVar4 = state[2].blocks.
             super__Vector_base<soul::FunctionParseState::BlockCode,_std::allocator<soul::FunctionParseState::BlockCode>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (pBVar4 == (pointer)0x0) {
      throwInternalCompilerError("object != nullptr","operator->",0x3c);
    }
    pcVar5 = pBVar4[0x25].code.data;
    if (pcVar5 != (char *)0x0) {
      pcVar6 = (char *)*in_RCX;
      sVar7 = in_RCX[1];
      pBVar8 = pBVar4[0x25].block;
      lVar10 = 0;
      do {
        other_01._M_str = pcVar6;
        other_01._M_len = sVar7;
        bVar9 = Identifier::operator==
                          ((Identifier *)
                           (*(long *)((long)(pBVar8->tempData).space + lVar10 + -0x68) + 0x30),
                           other_01);
        if (bVar9) {
          pp_Var11 = *(_func_int ***)((long)(pBVar8->tempData).space + lVar10 + -0x68);
          (this->
          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          )._vptr_Tokeniser = pp_Var11;
          if (pp_Var11 != (_func_int **)0x0) {
            return (pool_ptr<soul::heart::Variable>)this;
          }
          goto LAB_0022de20;
        }
        lVar10 = lVar10 + 8;
      } while ((long)pcVar5 << 3 != lVar10);
    }
    (this->
    super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
    )._vptr_Tokeniser = (_func_int **)0x0;
LAB_0022de20:
    plVar1 = *(long **)((long)&name[1].field_2 + 8);
    if (plVar1 != (long *)0x0) {
      lVar10 = *plVar1;
      plVar1 = *(long **)(lVar10 + 0x28);
      for (plVar13 = *(long **)(lVar10 + 0x20); plVar13 != plVar1; plVar13 = plVar13 + 1) {
        other_02._M_str = (char *)*in_RCX;
        other_02._M_len = in_RCX[1];
        bVar9 = Identifier::operator==((Identifier *)(*plVar13 + 0x30),other_02);
        if (bVar9) {
LAB_0022de60:
          pp_Var11 = (_func_int **)*plVar13;
LAB_0022de7a:
          (this->
          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          )._vptr_Tokeniser = pp_Var11;
          return (pool_ptr<soul::heart::Variable>)this;
        }
      }
    }
    Program::ProgramImpl::findVariableWithName((ProgramImpl *)this,(string *)state[1].currentBlock);
  }
  else {
    if (*(char *)*in_RCX != '$') {
      throwInternalCompilerError("name[0] == \'$\'","findVariable",0x461);
    }
    std::__cxx11::string::substr((ulong)&local_108,(ulong)in_RCX);
    TokenisedPathString::TokenisedPathString((TokenisedPathString *)local_e8,&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    TokenisedPathString::getLastPart_abi_cxx11_(&local_128,(TokenisedPathString *)local_e8);
    TokenisedPathString::getParentPath_abi_cxx11_(&local_168,(TokenisedPathString *)local_e8);
    std::operator+(&local_188,"$",&local_128);
    TokenisedPathString::join(&local_148,&local_168,&local_188);
    Program::ProgramImpl::findVariableWithName((ProgramImpl *)this,(string *)state[1].currentBlock);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != &local_188.field_2) {
      operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != &local_168.field_2) {
      operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    local_e8._40_8_ = 0;
    if (8 < (ulong)local_e8._48_8_) {
      if ((Section *)local_e8._32_8_ != (Section *)0x0) {
        operator_delete__((void *)local_e8._32_8_);
      }
      local_e8._32_8_ = local_e8 + 0x38;
      local_e8._48_8_ = 8;
    }
    if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
      operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
    }
  }
  return (pool_ptr<soul::heart::Variable>)(Variable *)this;
}

Assistant:

pool_ptr<heart::Variable> findVariable (const FunctionParseState& state, const std::string& name)
    {
        if (containsChar (name, ':'))
        {
            SOUL_ASSERT (name[0] == '$');
            TokenisedPathString path (name.substr (1));
            auto variableName = path.getLastPart();
            return program.findVariableWithName (TokenisedPathString::join (path.getParentPath(), "$" + variableName));
        }

        for (auto& v : state.variables)
            if (v->name == name)
                return v;

        for (auto& parameter : state.function.parameters)
            if (parameter->name == name)
                return parameter;

        if (auto stateVariable = module->stateVariables.find (name))
            return stateVariable;

        if (state.currentBlock != nullptr)
        {
            for (auto& blockParameter : state.currentBlock->block.parameters)
                if (blockParameter->name == name)
                    return blockParameter;
        }

        return program.findVariableWithName (name);
    }